

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

void __thiscall cmListFileBacktrace::PrintTitle(cmListFileBacktrace *this,ostream *out)

{
  element_type *peVar1;
  bool bVar2;
  cmState *pcVar3;
  string *psVar4;
  ostream *os;
  char *pcVar5;
  cmStateSnapshot bottom;
  cmListFileContext lfc;
  cmStateSnapshot local_c0;
  cmListFileContext local_a8;
  string local_60;
  cmStateDirectory local_40;
  
  peVar1 = (this->TopEntry).
           super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1 != (element_type *)0x0) &&
     ((peVar1->Parent).
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0)) {
    cmListFileContext::cmListFileContext(&local_a8,(cmListFileContext *)peVar1);
    GetBottom(&local_c0,this);
    pcVar3 = cmStateSnapshot::GetState(&local_c0);
    bVar2 = cmState::GetIsInTryCompile(pcVar3);
    if (!bVar2) {
      cmStateSnapshot::GetDirectory(&local_40,&local_c0);
      pcVar3 = cmStateSnapshot::GetState(&local_c0);
      psVar4 = cmState::GetSourceDirectory_abi_cxx11_(pcVar3);
      cmStateDirectory::ConvertToRelPathIfNotContained
                (&local_60,&local_40,psVar4,&local_a8.FilePath);
      std::__cxx11::string::operator=((string *)&local_a8.FilePath,(string *)&local_60);
      std::__cxx11::string::~string((string *)&local_60);
    }
    pcVar5 = " at ";
    if (local_a8.Line == 0) {
      pcVar5 = " in ";
    }
    os = std::operator<<(out,pcVar5);
    operator<<(os,&local_a8);
    cmListFileContext::~cmListFileContext(&local_a8);
  }
  return;
}

Assistant:

void cmListFileBacktrace::PrintTitle(std::ostream& out) const
{
  // The title exists only if we have a call on top of the bottom.
  if (!this->TopEntry || this->TopEntry->IsBottom()) {
    return;
  }
  cmListFileContext lfc = this->TopEntry->Context;
  cmStateSnapshot bottom = this->GetBottom();
  if (!bottom.GetState()->GetIsInTryCompile()) {
    lfc.FilePath = bottom.GetDirectory().ConvertToRelPathIfNotContained(
      bottom.GetState()->GetSourceDirectory(), lfc.FilePath);
  }
  out << (lfc.Line ? " at " : " in ") << lfc;
}